

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeRTASBuilderCreateExtPrologue
          (ZEParameterValidation *this,ze_driver_handle_t hDriver,
          ze_rtas_builder_ext_desc_t *pDescriptor,ze_rtas_builder_ext_handle_t *phBuilder)

{
  ze_result_t zVar1;
  
  if (hDriver != (ze_driver_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if ((phBuilder != (ze_rtas_builder_ext_handle_t *)0x0 &&
         pDescriptor != (ze_rtas_builder_ext_desc_t *)0x0) &&
       (zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION, (int)pDescriptor->builderVersion < 0x10001)) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeRTASBuilderCreateExtPrologue(
        ze_driver_handle_t hDriver,                     ///< [in] handle of driver object
        const ze_rtas_builder_ext_desc_t* pDescriptor,  ///< [in] pointer to builder descriptor
        ze_rtas_builder_ext_handle_t* phBuilder         ///< [out] handle of builder object
        )
    {
        if( nullptr == hDriver )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == pDescriptor )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phBuilder )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( ZE_RTAS_BUILDER_EXT_VERSION_CURRENT < pDescriptor->builderVersion )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(pDescriptor);
    }